

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.h
# Opt level: O3

DegreeTableEntry * __thiscall
ADS::DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*>::add
          (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *this,
          uint uiIndex,DegreeTableEntry *element)

{
  DegreeTableEntry *pDVar1;
  bool bVar2;
  uint uiLastIndex;
  
  uiLastIndex = uiIndex - this->_uiOff;
  if (uiLastIndex < this->_uiOff) {
    return (DegreeTableEntry *)0x0;
  }
  if (this->_uiLen <= uiLastIndex) {
    if (this->_bCanGrow != true) {
      return (DegreeTableEntry *)0x0;
    }
    bVar2 = grow(this,uiLastIndex);
    if (!bVar2) {
      return (DegreeTableEntry *)0x0;
    }
    uiLastIndex = uiIndex - this->_uiOff;
  }
  pDVar1 = this->_pDArray[uiLastIndex];
  this->_pDArray[uiLastIndex] = element;
  return pDVar1;
}

Assistant:

T
    DArray<T>::add (unsigned int uiIndex, T element)
    {
        if (!checkBound (shiftIndex (uiIndex)))
            return NULL;
        T tmp = _pDArray[shiftIndex (uiIndex)];
        _pDArray[shiftIndex (uiIndex)] = element;
        return tmp;
    }